

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIFileOpenDialog::fillListBox(CGUIFileOpenDialog *this)

{
  int *piVar1;
  IFileList *pIVar2;
  _func_int *p_Var3;
  IGUIListBox *pIVar4;
  _Alloc_hider _Var5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  undefined4 extraout_var;
  path *p;
  undefined4 extraout_var_00;
  uint uVar9;
  CGUIFileOpenDialog *pCVar10;
  stringw s;
  stringw local_50;
  
  plVar8 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (((this->FileSystem != (IFileSystem *)0x0) && (plVar8 != (long *)0x0)) &&
     (this->FileBox != (IGUIListBox *)0x0)) {
    pIVar2 = this->FileList;
    if (pIVar2 != (IFileList *)0x0) {
      p_Var3 = pIVar2->_vptr_IFileList[-3];
      piVar1 = (int *)(&pIVar2->field_0x10 + (long)p_Var3);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar2->_vptr_IFileList + (long)p_Var3) + 8))();
      }
    }
    (*(this->FileBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])();
    iVar6 = (*this->FileSystem->_vptr_IFileSystem[0x18])();
    this->FileList = (IFileList *)CONCAT44(extraout_var,iVar6);
    local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
    local_50.str._M_string_length = 0;
    local_50.str.field_2._M_local_buf[0] = L'\0';
    if ((IFileList *)CONCAT44(extraout_var,iVar6) != (IFileList *)0x0) {
      iVar6 = (**this->FileList->_vptr_IFileList)();
      if (iVar6 != 0) {
        uVar9 = 0;
        do {
          pCVar10 = (CGUIFileOpenDialog *)this->FileList;
          p = (path *)(**(code **)(*(long *)pCVar10 + 8))(pCVar10,uVar9);
          pathToStringW(pCVar10,&local_50,p);
          _Var5._M_p = local_50.str._M_dataplus._M_p;
          pIVar4 = this->FileBox;
          uVar7 = (*this->FileList->_vptr_IFileList[6])(this->FileList,(ulong)uVar9);
          uVar7 = (**(code **)(*plVar8 + 0x50))(plVar8,(uVar7 & 0xff) + 0x15);
          (*(pIVar4->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x27])
                    (pIVar4,_Var5._M_p,(ulong)uVar7);
          uVar9 = uVar9 + 1;
          uVar7 = (**this->FileList->_vptr_IFileList)();
        } while (uVar9 < uVar7);
      }
    }
    if (this->FileNameText != (IGUIEditBox *)0x0) {
      iVar6 = (*this->FileSystem->_vptr_IFileSystem[0x11])();
      pCVar10 = this;
      setDirectoryName(this,(path *)CONCAT44(extraout_var_00,iVar6));
      pathToStringW(pCVar10,&local_50,&this->FileDirectory);
      (*(this->FileNameText->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])
                (this->FileNameText,local_50.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p,
                      CONCAT44(local_50.str.field_2._M_local_buf[1],
                               local_50.str.field_2._M_local_buf[0]) * 4 + 4);
    }
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::fillListBox()
{
	IGUISkin *skin = Environment->getSkin();

	if (!FileSystem || !FileBox || !skin)
		return;

	if (FileList)
		FileList->drop();

	FileBox->clear();

	FileList = FileSystem->createFileList();
	core::stringw s;

	if (FileList) {
		for (u32 i = 0; i < FileList->getFileCount(); ++i) {
			pathToStringW(s, FileList->getFileName(i));
			FileBox->addItem(s.c_str(), skin->getIcon(FileList->isDirectory(i) ? EGDI_DIRECTORY : EGDI_FILE));
		}
	}

	if (FileNameText) {
		setDirectoryName(FileSystem->getWorkingDirectory());
		pathToStringW(s, FileDirectory);
		FileNameText->setText(s.c_str());
	}
}